

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_smoothStep_float(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = c->in[0].m_data[2];
  fVar1 = c->in[2].m_data[1];
  fVar3 = 0.0;
  if (fVar2 < fVar1) {
    fVar3 = c->in[1].m_data[0];
    if (fVar3 <= fVar1) {
      fVar3 = 1.0;
    }
    else {
      fVar2 = (fVar1 - fVar2) / (fVar3 - fVar2);
      fVar3 = (3.0 - (fVar2 + fVar2)) * fVar2 * fVar2;
    }
  }
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

Vector<T, 1>			swizzle		(int a) const { DE_ASSERT(a >= 0 && a < Size); return Vector<T, 1>(m_data[a]); }